

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameRunner.cpp
# Opt level: O2

void runGame(void)

{
  bool bVar1;
  int iVar2;
  allocator local_101;
  string local_100;
  string local_e0;
  string local_c0;
  Game aGame;
  
  Game::Game(&aGame);
  std::__cxx11::string::string((string *)&local_c0,"Chet",&local_101);
  Game::add(&aGame,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_e0,"Pat",&local_101);
  Game::add(&aGame,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_100,"Sue",&local_101);
  Game::add(&aGame,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  do {
    iVar2 = rand();
    Game::roll(&aGame,iVar2 % 5 + 1);
    iVar2 = rand();
    if (iVar2 % 9 == 7) {
      bVar1 = Game::wrongAnswer(&aGame);
    }
    else {
      bVar1 = Game::wasCorrectlyAnswered(&aGame);
    }
  } while (bVar1 != false);
  Game::~Game(&aGame);
  return;
}

Assistant:

void runGame() {
  Game aGame;

  aGame.add("Chet");
  aGame.add("Pat");
  aGame.add("Sue");

  do {

    aGame.roll(rand() % 5 + 1);

    if (rand() % 9 == 7) {
      notAWinner = aGame.wrongAnswer();
    } else {
      notAWinner = aGame.wasCorrectlyAnswered();
    }
  } while (notAWinner);
}